

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_add1_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,_Bool inplace)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  int line;
  
  if ((((b->ne[0] == 1) && (b->ne[1] == 1)) && (b->ne[2] == 1)) && (b->ne[3] == 1)) {
    if (((a->nb[0] == type_traits[a->type].type_size) && (a->nb[2] == a->ne[1] * a->nb[1])) &&
       (a->nb[3] == a->nb[2] * a->ne[2])) {
      if (inplace) {
        pgVar1 = ggml_view_tensor(ctx,a);
      }
      else {
        pgVar1 = ggml_new_tensor_impl(ctx,a->type,4,a->ne,(ggml_tensor *)0x0,0);
      }
      pgVar1->op = GGML_OP_ADD1;
      pgVar1->src[0] = a;
      pgVar1->src[1] = b;
      return pgVar1;
    }
    pcVar2 = "ggml_is_padded_1d(a)";
    line = 0x785;
  }
  else {
    pcVar2 = "ggml_is_scalar(b)";
    line = 0x784;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

static struct ggml_tensor * ggml_add1_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        bool                  inplace) {
    GGML_ASSERT(ggml_is_scalar(b));
    GGML_ASSERT(ggml_is_padded_1d(a));

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    result->op     = GGML_OP_ADD1;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}